

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.cc
# Opt level: O3

Expression __thiscall
cnn::DeepLSTMBuilder::add_input_impl(DeepLSTMBuilder *this,int prev,Expression *x)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  DeepLSTMBuilder *pDVar4;
  undefined8 *in_RCX;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  long extraout_RDX;
  long lVar8;
  ComputationGraph *pCVar9;
  undefined4 in_register_00000034;
  long lVar10;
  VariableIndex VVar11;
  bool bVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  Expression EVar13;
  Expression i_aot;
  Expression i_ot;
  Expression i_ait;
  Expression i_wt;
  Expression i_it;
  Expression ph_t;
  Expression i_ft;
  Expression i_awt;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> cc;
  undefined4 local_1cc;
  undefined1 local_1c8 [8];
  ulong local_1c0;
  long local_1b8;
  long local_1b0;
  uint local_1a4;
  undefined1 local_1a0 [8];
  VariableIndex local_198;
  pointer local_190;
  undefined4 local_188;
  ComputationGraph *local_180;
  uint local_178;
  ExecutionEngine *local_170;
  undefined4 local_168;
  undefined8 local_160;
  undefined4 local_158;
  undefined8 local_150;
  undefined4 local_148;
  ComputationGraph *local_140;
  uint local_138;
  long local_130;
  undefined8 local_128;
  undefined1 local_120 [8];
  ulong local_118;
  initializer_list<cnn::expr::Expression> local_110;
  Expression local_100;
  Expression local_f0;
  long local_e0;
  Expression local_d8;
  initializer_list<cnn::expr::Expression> local_c8;
  Expression local_b8;
  ComputationGraph *local_a8;
  uint local_a0;
  undefined8 *local_98;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_90;
  long local_78;
  DeepLSTMBuilder *local_70;
  long *local_68;
  long *local_60;
  long local_58;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_50;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_48;
  long local_40;
  ulong local_38;
  
  lVar8 = CONCAT44(in_register_00000034,prev);
  local_1a4 = (uint)x;
  local_98 = in_RCX;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_1a0,
             (ulong)*(uint *)(lVar8 + 0xd8),(allocator_type *)&local_90);
  local_48 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar8 + 0x58);
  local_130 = lVar8;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_48,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_1a0);
  if (local_1a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a0);
  }
  lVar8 = local_130;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_1a0,
             (ulong)*(uint *)(local_130 + 0xd8),(allocator_type *)&local_90);
  local_50 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar8 + 0x70);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_50,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      local_1a0);
  local_70 = this;
  if (local_1a0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a0);
  }
  lVar8 = local_130;
  local_1a0 = (undefined1  [8])0x0;
  local_198.t = 0;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
  emplace_back<cnn::expr::Expression>
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             (local_130 + 0x88),(Expression *)local_1a0);
  local_40 = *(long *)(lVar8 + 0x60);
  local_e0 = *(long *)(lVar8 + 0x78);
  local_78 = *(long *)(lVar8 + 0x90);
  pCVar9 = (ComputationGraph *)*local_98;
  VVar11.t = *(uint *)(local_98 + 1);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_90,(ulong)*(uint *)(lVar8 + 0xd8),(allocator_type *)local_1a0);
  if (*(int *)(lVar8 + 0xd8) != 0) {
    local_60 = (long *)(lVar8 + 0xa8);
    local_68 = (long *)(lVar8 + 0xc0);
    local_1b8 = 0;
    local_58 = (ulong)local_1a4 << 3;
    lVar10 = 0;
    uVar6 = 0;
    do {
      local_38 = uVar6;
      if (lVar10 != 0) {
        local_190 = (pointer)*local_98;
        local_188 = *(undefined4 *)(local_98 + 1);
        local_120 = (undefined1  [8])local_1a0;
        local_118 = 2;
        local_1a0 = (undefined1  [8])pCVar9;
        local_198.t = VVar11.t;
        expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_b8,(initializer_list<cnn::expr::Expression> *)local_120);
        pCVar9 = local_b8.pg;
        VVar11.t = local_b8.i.t;
      }
      local_1b0 = *(long *)(lVar8 + 0x40);
      local_b8.pg = (ComputationGraph *)0x0;
      local_b8.i.t = 0;
      bVar1 = *(byte *)(lVar8 + 0xa0);
      bVar12 = (int)local_1a4 < 0;
      if (bVar12) {
        plVar5 = local_68;
        plVar7 = local_60;
        if ((bVar1 & 1) != 0) goto LAB_0018b4a1;
        local_1cc = 0;
        local_128 = 0;
      }
      else {
        plVar5 = (long *)(local_58 * 3 + *(long *)local_50);
        plVar7 = (long *)(*(long *)local_48 + local_58 * 3);
LAB_0018b4a1:
        local_128 = *(undefined8 *)(*plVar7 + lVar10);
        local_1cc = *(undefined4 *)(*plVar7 + 8 + lVar10);
        local_b8.pg = *(ComputationGraph **)(*plVar5 + lVar10);
        local_b8.i.t = *(uint *)(*plVar5 + 8 + lVar10);
      }
      local_120 = (undefined1  [8])0x0;
      local_118 = local_118 & 0xffffffff00000000;
      local_180 = pCVar9;
      local_178 = VVar11.t;
      if (bVar12 && (bVar1 & 1) == 0) {
        puVar2 = *(undefined8 **)(local_1b0 + local_1b8);
        local_1a0 = (undefined1  [8])puVar2[6];
        local_198.t = *(uint *)(puVar2 + 7);
        local_190 = (pointer)*puVar2;
        local_188 = *(undefined4 *)(puVar2 + 1);
        local_c8._M_array = (iterator)local_1a0;
        local_c8._M_len = 3;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_f0,&local_c8);
      }
      else {
        puVar2 = *(undefined8 **)(local_1b0 + local_1b8);
        local_1a0 = (undefined1  [8])puVar2[6];
        local_198.t = *(uint *)(puVar2 + 7);
        local_190 = (pointer)*puVar2;
        local_188 = *(undefined4 *)(puVar2 + 1);
        local_170 = (ExecutionEngine *)puVar2[2];
        local_168 = *(undefined4 *)(puVar2 + 3);
        local_160 = local_128;
        local_158 = local_1cc;
        local_150 = puVar2[4];
        local_148 = *(undefined4 *)(puVar2 + 5);
        local_c8._M_array = (iterator)local_1a0;
        local_c8._M_len = 7;
        local_140 = local_b8.pg;
        local_138 = local_b8.i.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_f0,&local_c8);
      }
      local_120 = (undefined1  [8])local_f0.pg;
      local_118 = CONCAT44(local_118._4_4_,local_f0.i.t);
      expr::logistic((expr *)&local_f0,(Expression *)local_120);
      expr::operator-((expr *)&local_c8,1.0,&local_f0);
      local_a8 = (ComputationGraph *)0x0;
      local_a0 = 0;
      if (bVar12 && (bVar1 & 1) == 0) {
        lVar8 = *(long *)(local_1b0 + local_1b8);
        local_1a0 = *(undefined1 (*) [8])(lVar8 + 0xa0);
        local_198.t = *(uint *)(lVar8 + 0xa8);
        local_190 = *(pointer *)(lVar8 + 0x80);
        local_188 = *(undefined4 *)(lVar8 + 0x88);
        local_1c8 = (undefined1  [8])local_1a0;
        local_1c0 = 3;
        local_180 = pCVar9;
        local_178 = VVar11.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_100,(initializer_list<cnn::expr::Expression> *)local_1c8);
        __x = extraout_XMM0_Qa_00;
      }
      else {
        lVar8 = *(long *)(local_1b0 + local_1b8);
        local_1a0 = *(undefined1 (*) [8])(lVar8 + 0xa0);
        local_198.t = *(uint *)(lVar8 + 0xa8);
        local_190 = *(pointer *)(lVar8 + 0x80);
        local_188 = *(undefined4 *)(lVar8 + 0x88);
        local_170 = *(ExecutionEngine **)(lVar8 + 0x90);
        local_168 = *(undefined4 *)(lVar8 + 0x98);
        local_160 = local_128;
        local_158 = local_1cc;
        local_1c8 = (undefined1  [8])local_1a0;
        local_1c0 = 5;
        local_180 = pCVar9;
        local_178 = VVar11.t;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_100,(initializer_list<cnn::expr::Expression> *)local_1c8);
        __x = extraout_XMM0_Qa;
      }
      local_a8 = local_100.pg;
      local_a0 = local_100.i.t;
      expr::tanh((expr *)&local_100,__x);
      if (bVar12 && (bVar1 & 1) == 0) {
        expr::cwise_multiply((expr *)local_1a0,&local_f0,&local_100);
        lVar8 = local_130;
        lVar3 = *(long *)(local_e0 + -0x18);
        *(undefined1 (*) [8])(lVar3 + lVar10) = local_1a0;
        *(uint *)(lVar3 + 8 + lVar10) = local_198.t;
        local_1c8 = (undefined1  [8])0x0;
        local_1c0 = local_1c0 & 0xffffffff00000000;
        lVar3 = *(long *)(local_1b0 + local_1b8);
        local_1a0 = *(undefined1 (*) [8])(lVar3 + 0x70);
        local_198.t = *(uint *)(lVar3 + 0x78);
        local_190 = *(pointer *)(lVar3 + 0x40);
        local_188 = *(undefined4 *)(lVar3 + 0x48);
        local_110._M_len = 3;
        local_180 = pCVar9;
        local_178 = VVar11.t;
        local_110._M_array = (iterator)local_1a0;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,&local_110);
      }
      else {
        expr::cwise_multiply((expr *)local_1a0,&local_f0,&local_100);
        lVar8 = local_130;
        expr::cwise_multiply((expr *)local_1c8,(Expression *)&local_c8,&local_b8);
        expr::operator+((expr *)&local_d8,(Expression *)local_1c8,(Expression *)local_1a0);
        lVar3 = *(long *)(local_e0 + -0x18);
        *(ComputationGraph **)(lVar3 + lVar10) = local_d8.pg;
        *(uint *)(lVar3 + 8 + lVar10) = local_d8.i.t;
        local_1c8 = (undefined1  [8])0x0;
        local_1c0 = local_1c0 & 0xffffffff00000000;
        lVar3 = *(long *)(local_1b0 + local_1b8);
        local_1a0 = *(undefined1 (*) [8])(lVar3 + 0x70);
        local_198.t = *(uint *)(lVar3 + 0x78);
        local_190 = *(pointer *)(lVar3 + 0x40);
        local_188 = *(undefined4 *)(lVar3 + 0x48);
        local_170 = *(ExecutionEngine **)(lVar3 + 0x50);
        local_168 = *(undefined4 *)(lVar3 + 0x58);
        local_160 = local_128;
        local_158 = local_1cc;
        local_150 = *(undefined8 *)(lVar3 + 0x60);
        local_148 = *(undefined4 *)(lVar3 + 0x68);
        local_140 = *(ComputationGraph **)(*(long *)(local_e0 + -0x18) + lVar10);
        local_138 = *(uint *)(*(long *)(local_e0 + -0x18) + 8 + lVar10);
        local_110._M_len = 7;
        local_180 = pCVar9;
        local_178 = VVar11.t;
        local_110._M_array = (iterator)local_1a0;
        expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&local_d8,&local_110);
      }
      local_1c8 = (undefined1  [8])local_d8.pg;
      local_1c0 = CONCAT44(local_1c0._4_4_,local_d8.i.t);
      expr::logistic((expr *)local_1a0,(Expression *)local_1c8);
      expr::tanh((expr *)&local_d8,__x_00);
      expr::cwise_multiply((expr *)&local_110,(Expression *)local_1a0,&local_d8);
      lVar3 = *(long *)(local_40 + -0x18);
      *(iterator *)(lVar3 + lVar10) = local_110._M_array;
      *(uint *)(lVar3 + 8 + lVar10) = (uint)local_110._M_len;
      *(iterator *)
       ((long)&(local_90.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + lVar10) = local_110._M_array;
      *(uint *)((long)&((local_90.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar10) =
           (uint)local_110._M_len;
      uVar6 = local_38 + 1;
      lVar10 = lVar10 + 0x10;
      local_1b8 = local_1b8 + 0x18;
      pCVar9 = (ComputationGraph *)local_110._M_array;
      VVar11.t = (uint)local_110._M_len;
    } while (uVar6 < *(uint *)(lVar8 + 0xd8));
  }
  expr::detail::
  f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((detail *)local_1a0,&local_90);
  pDVar4 = local_70;
  *(undefined1 (*) [8])(local_78 + -0x10) = local_1a0;
  *(uint *)(local_78 + -8) = local_198.t;
  (local_70->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)local_1a0;
  (local_70->super_RNNBuilder).cur.t = local_198.t;
  if (local_90.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    local_78 = extraout_RDX;
  }
  EVar13._8_8_ = local_78;
  EVar13.pg = (ComputationGraph *)pDVar4;
  return EVar13;
}

Assistant:

Expression DeepLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  o.push_back(Expression());
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression& ot = o.back();
  Expression in = x;
  vector<Expression> cc(layers);
  for (unsigned i = 0; i < layers; ++i) {
    if (i > 0)
      in = concatenate({in, x});
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state)
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + vars[C2I] * i_c_tm1;
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + vars[C2O] * ct[i];
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
    cc[i] = in;
  }
  ot = concatenate(cc);
  return ot;
}